

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O2

Function * __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::getFunctionOrImport
          (LegalizeJSInterface *this,Module *module,Name name,Type params,Type results)

{
  char *pcVar1;
  _Head_base<0UL,_wasm::Function_*,_false> _Var2;
  Name name_00;
  Name module_00;
  Signature sig;
  Name name_01;
  Name base;
  undefined1 local_e8 [8];
  ImportInfo info;
  HeapType local_50;
  Type local_48;
  Type local_40;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)module;
  local_48.id = params.id;
  _Var2._M_head_impl = Module::getFunctionOrNull((Module *)this,name_00);
  if ((_Head_base<0UL,_wasm::Function_*,_false>)_Var2._M_head_impl ==
      (_Head_base<0UL,_wasm::Function_*,_false>)0x0) {
    local_40.id = (uintptr_t)name.super_IString.str._M_str;
    ImportInfo::ImportInfo((ImportInfo *)local_e8,(Module *)this);
    module_00.super_IString.str._M_str = DAT_01174c48;
    module_00.super_IString.str._M_len = ENV;
    base.super_IString.str._M_str = (char *)name_00.super_IString.str._M_str;
    base.super_IString.str._M_len = (size_t)module;
    _Var2._M_head_impl = ImportInfo::getImportedFunction((ImportInfo *)local_e8,module_00,base);
    if (_Var2._M_head_impl == (Function *)0x0) {
      sig.results.id = local_48.id;
      sig.params.id = local_40.id;
      HeapType::HeapType(&local_50,sig);
      info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      name_01.super_IString.str._M_str = (char *)module;
      name_01.super_IString.str._M_len = (size_t)&local_38;
      Builder::makeFunction
                (name_01,name_00.super_IString.str._M_str,
                 (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_50.id,
                 (Expression *)
                 &info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      pcVar1 = DAT_01174c48;
      (((Name *)((long)local_38._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18))->
      super_IString).str._M_len = ENV;
      *(char **)((long)local_38._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20) = pcVar1
      ;
      (((Name *)((long)local_38._M_t.
                       super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                       .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x28))->
      super_IString).str._M_len = (size_t)module;
      *(uintptr_t *)
       ((long)local_38._M_t.
              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
              super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x30) =
           name_00.super_IString.str._M_str;
      Module::addFunction((Module *)this,&local_38);
      std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_38);
      _Var2._M_head_impl =
           (Function *)
           local_38._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
           ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
           super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    }
    ImportInfo::~ImportInfo((ImportInfo *)local_e8);
  }
  return (Function *)
         (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
         _Var2._M_head_impl;
}

Assistant:

static Function*
  getFunctionOrImport(Module* module, Name name, Type params, Type results) {
    // First look for the function by name
    if (Function* f = module->getFunctionOrNull(name)) {
      return f;
    }
    // Then see if its already imported
    ImportInfo info(*module);
    if (Function* f = info.getImportedFunction(ENV, name)) {
      return f;
    }
    // Failing that create a new function import.
    auto import = Builder::makeFunction(name, Signature(params, results), {});
    import->module = ENV;
    import->base = name;
    auto* ret = import.get();
    module->addFunction(std::move(import));
    return ret;
  }